

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

void __thiscall
slang::SmallVectorBase<BindEntry>::cleanup(SmallVectorBase<BindEntry> *this,EVP_PKEY_CTX *ctx)

{
  std::ranges::__destroy_fn::operator()<slang::SmallVectorBase<BindEntry>_&>
            ((__destroy_fn *)this,(SmallVectorBase<BindEntry> *)ctx);
  if (this->data_ != (pointer)this->firstElement) {
    operator_delete(this->data_);
    return;
  }
  return;
}

Assistant:

void cleanup() {
        std::ranges::destroy(*this);
        if (!isSmall())
            ::operator delete(data_);
    }